

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O2

void Abc_NtkIncrementTravId(Abc_Ntk_t *p)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint nCapMin;
  
  if ((p->vTravIds).pArray == (int *)0x0) {
    nCapMin = p->vObjs->nSize + 500;
    Vec_IntGrow(&p->vTravIds,nCapMin);
    uVar2 = 0;
    uVar3 = 0;
    if (0 < (int)nCapMin) {
      uVar3 = (ulong)nCapMin;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      (p->vTravIds).pArray[uVar2] = 0;
    }
    (p->vTravIds).nSize = nCapMin;
  }
  iVar1 = p->nTravIds;
  p->nTravIds = iVar1 + 1;
  if (iVar1 < 0x3fffffff) {
    return;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

static inline void        Abc_NtkIncrementTravId( Abc_Ntk_t * p )           { if (!p->vTravIds.pArray) Vec_IntFill(&p->vTravIds, Abc_NtkObjNumMax(p)+500, 0); p->nTravIds++; assert(p->nTravIds < (1<<30));  }